

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disjunctiveMonotone.c
# Opt level: O1

void printAllIntVectorsStabil(Vec_Ptr_t *vDisjunctions,Abc_Ntk_t *pNtk,char *fileName)

{
  int iVar1;
  void *pvVar2;
  FILE *__s;
  char *pcVar3;
  size_t __size;
  long lVar4;
  long lVar5;
  
  __s = fopen(fileName,"a");
  if (0 < vDisjunctions->nSize) {
    lVar4 = 0;
    do {
      pvVar2 = vDisjunctions->pArray[lVar4];
      printf("INT[%d] : ( ");
      fwrite("( ",2,1,__s);
      if (0 < *(int *)((long)pvVar2 + 4)) {
        lVar5 = 0;
        do {
          iVar1 = *(int *)(*(long *)((long)pvVar2 + 8) + lVar5 * 4);
          if (((long)iVar1 < 0) || (pNtk->vPos->nSize <= iVar1)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pcVar3 = Abc_ObjName((Abc_Obj_t *)pNtk->vPos->pArray[iVar1]);
          pcVar3 = strstr(pcVar3,"csLevel1Stabil");
          if (pcVar3 == (char *)0x0) {
            __assert_fail("hintSubStr",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/disjunctiveMonotone.c"
                          ,0x222,"void printAllIntVectorsStabil(Vec_Ptr_t *, Abc_Ntk_t *, char *)");
          }
          printf("%s",pcVar3);
          fputs(pcVar3,__s);
          if (lVar5 < (long)*(int *)((long)pvVar2 + 4) + -1) {
            printf(" || ");
            __size = 4;
            pcVar3 = " || ";
          }
          else {
            puts(" )");
            __size = 3;
            pcVar3 = " )\n";
          }
          fwrite(pcVar3,__size,1,__s);
          lVar5 = lVar5 + 1;
        } while (lVar5 < *(int *)((long)pvVar2 + 4));
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < vDisjunctions->nSize);
  }
  fclose(__s);
  return;
}

Assistant:

void printAllIntVectorsStabil(Vec_Ptr_t *vDisjunctions, Abc_Ntk_t *pNtk, char *fileName)
{
	Vec_Int_t *vElem;
	int i, j, iElem;
	char *name, *hintSubStr;
	FILE *fp;

	fp = fopen( fileName, "a" );

	Vec_PtrForEachEntry(Vec_Int_t *, vDisjunctions, vElem, i)
	{	
		printf("INT[%d] : ( ", i);
		fprintf(fp, "( ");
		Vec_IntForEachEntry( vElem, iElem, j )
		{
			name = Abc_ObjName( Abc_NtkPo(pNtk, iElem));
			hintSubStr = strstr( name, "csLevel1Stabil");
			assert( hintSubStr );
			printf("%s", hintSubStr);
			fprintf(fp, "%s", hintSubStr);
			if( j < Vec_IntSize(vElem) - 1 )
			{
				printf(" || ");
				fprintf(fp, " || ");
			}
			else
			{
				printf(" )\n");
				fprintf(fp, " )\n");
			}
		}
		//printf(")\n");
	}
	fclose(fp);
}